

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O2

void __thiscall RenX_ServerListPlugin::~RenX_ServerListPlugin(RenX_ServerListPlugin *this)

{
  undefined8 uVar1;
  undefined8 in_R9;
  undefined4 local_60;
  undefined4 uStack_58;
  undefined4 local_50;
  undefined4 uStack_48;
  undefined4 local_40;
  undefined4 uStack_38;
  
  *(undefined ***)this = &PTR_think_001197a0;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_00119c80;
  uVar1 = getHTTPServer();
  local_40 = (undefined4)(this->m_server_list_page_name)._M_string_length;
  uStack_38 = SUB84((this->m_server_list_page_name)._M_dataplus._M_p,0);
  Jupiter::HTTP::Server::remove
            (uVar1,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p,in_R9,local_40,
             uStack_38);
  local_50 = (undefined4)(this->m_server_list_long_page_name)._M_string_length;
  uStack_48 = SUB84((this->m_server_list_long_page_name)._M_dataplus._M_p,0);
  Jupiter::HTTP::Server::remove
            (uVar1,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p,in_R9,local_50,
             uStack_48);
  local_60 = (undefined4)(this->m_server_page_name)._M_string_length;
  uStack_58 = SUB84((this->m_server_page_name)._M_dataplus._M_p,0);
  Jupiter::HTTP::Server::remove
            (uVar1,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p,in_R9,local_60,
             uStack_58);
  std::__cxx11::string::~string((string *)&this->m_metadata_prometheus_page_name);
  std::__cxx11::string::~string((string *)&this->m_metadata_page_name);
  std::__cxx11::string::~string((string *)&this->m_server_page_name);
  std::__cxx11::string::~string((string *)&this->m_server_list_long_page_name);
  std::__cxx11::string::~string((string *)&this->m_server_list_page_name);
  std::__cxx11::string::~string((string *)&this->m_web_path);
  std::__cxx11::string::~string((string *)&this->m_web_hostname);
  std::__cxx11::string::~string((string *)&this->m_metadata_prometheus);
  std::__cxx11::string::~string((string *)&this->m_metadata_json);
  std::__cxx11::string::~string((string *)&this->m_server_list_json);
  RenX::Plugin::~Plugin(&this->super_Plugin);
  return;
}

Assistant:

RenX_ServerListPlugin::~RenX_ServerListPlugin() {
	Jupiter::HTTP::Server &server = getHTTPServer();
	server.remove(m_web_hostname, m_web_path, m_server_list_page_name);
	server.remove(m_web_hostname, m_web_path, m_server_list_long_page_name);
	server.remove(m_web_hostname, m_web_path, m_server_page_name);
}